

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall QSocks5SocketEnginePrivate::sendRequestMethod(QSocks5SocketEnginePrivate *this)

{
  long lVar1;
  bool bVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char command;
  quint16 port;
  QByteArray sealedBuf;
  QByteArray buf;
  QHostAddress address;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 uVar3;
  undefined2 in_stack_ffffffffffffffb6;
  undefined2 uVar4;
  QByteArray *in_stack_ffffffffffffffc0;
  QByteArray *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  quint16 port_00;
  QByteArray *pBuf;
  quint16 port_01;
  QString *hostname;
  
  port_00 = (quint16)((ulong)in_stack_ffffffffffffffd0 >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHostAddress::QHostAddress
            ((QHostAddress *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT15(in_stack_ffffffffffffffb5,
                               CONCAT14(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))));
  if (*(int *)((long)&((totally_ordered_wrapper<QHostAddressPrivate_*> *)&in_RDI[9].d.d)->ptr + 4)
      == 1) {
    uVar3 = 1;
    QHostAddress::operator=
              ((QHostAddress *)
               (ulong)CONCAT15(1,CONCAT14(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
               (QHostAddress *)in_RDI);
    uVar4 = *(undefined2 *)&((totally_ordered_wrapper<QHostAddressPrivate_*> *)&in_RDI[8].d.d)->ptr;
  }
  else if (*(int *)((long)&((totally_ordered_wrapper<QHostAddressPrivate_*> *)&in_RDI[9].d.d)->ptr +
                   4) == 2) {
    uVar3 = 2;
    QHostAddress::operator=
              ((QHostAddress *)
               (ulong)CONCAT15(2,CONCAT14(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
               (QHostAddress *)in_RDI);
    uVar4 = *(undefined2 *)&in_RDI[7].d.ptr;
  }
  else {
    uVar3 = 3;
    QHostAddress::operator=
              ((QHostAddress *)
               (ulong)CONCAT15(3,CONCAT14(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
               (QHostAddress *)in_RDI);
    uVar4 = *(undefined2 *)&in_RDI[7].d.ptr;
  }
  pBuf = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  port_01 = 0xaaaa;
  hostname = (QString *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x370d82);
  QByteArray::reserve(in_stack_ffffffffffffffc0,(qsizetype)pBuf);
  QByteArray::append(-0x28);
  QByteArray::append(-0x28);
  QByteArray::append(-0x28);
  bVar2 = QString::isEmpty((QString *)0x370dcb);
  if (((!bVar2) ||
      (bVar2 = qt_socks5_set_host_address_and_port
                         ((QHostAddress *)pBuf,port_00,in_stack_ffffffffffffffc8), bVar2)) &&
     ((bVar2 = QString::isEmpty((QString *)0x370e06), bVar2 ||
      (bVar2 = qt_socks5_set_host_name_and_port(hostname,port_01,pBuf), bVar2)))) {
    QByteArray::QByteArray((QByteArray *)0x370e65);
    QSocks5Authenticator::seal
              ((QSocks5Authenticator *)
               CONCAT26(uVar4,CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffffb4,
                                                      in_stack_ffffffffffffffb0))),in_RDI,
               (QByteArray *)0x370e83);
    QIODevice::write(*(QByteArray **)in_RDI[10].d.ptr);
    QAbstractSocket::flush((QAbstractSocket *)0x370eb4);
    *(undefined4 *)&in_RDI[9].d.d = 5;
    QByteArray::~QByteArray((QByteArray *)0x370ecc);
  }
  QByteArray::~QByteArray((QByteArray *)0x370ede);
  QHostAddress::~QHostAddress((QHostAddress *)0x370ee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::sendRequestMethod()
{
    QHostAddress address;
    quint16 port = 0;
    char command = 0;
    if (mode == ConnectMode) {
        command = S5_CONNECT;
        address = peerAddress;
        port = peerPort;
    } else if (mode == BindMode) {
        command = S5_BIND;
        address = localAddress;
        port = localPort;
    } else {
#ifndef QT_NO_UDPSOCKET
        command = S5_UDP_ASSOCIATE;
        address = localAddress; //data->controlSocket->localAddress();
        port = localPort;
#endif
    }

    QByteArray buf;
    buf.reserve(270); // big enough for domain name;
    buf.append(char(S5_VERSION_5));
    buf.append(command);
    buf.append('\0');
    if (peerName.isEmpty() && !qt_socks5_set_host_address_and_port(address, port, &buf)) {
        QSOCKS5_DEBUG << "error setting address" << address << " : " << port;
        //### set error code ....
        return;
    } else if (!peerName.isEmpty() && !qt_socks5_set_host_name_and_port(peerName, port, &buf)) {
        QSOCKS5_DEBUG << "error setting peer name" << peerName << " : " << port;
        //### set error code ....
        return;
    }
    QSOCKS5_DEBUG << "sending" << dump(buf);
    QByteArray sealedBuf;
    if (!data->authenticator->seal(buf, &sealedBuf)) {
        // ### Handle this error.
    }
    data->controlSocket->write(sealedBuf);
    data->controlSocket->flush();
    socks5State = RequestMethodSent;
}